

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teaminfo.cpp
# Opt level: O1

void __thiscall FTeam::ParseTeamDefinition(FTeam *this,FScanner *Scan)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FTeam Team;
  FTeam local_68;
  
  local_68.m_Name.Chars = FString::NullString.Nothing;
  local_68.m_TextColor.Chars = FString::NullString.Nothing;
  local_68.m_Logo.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 3;
  local_68.m_iPlayerColor = 0;
  local_68.m_bAllowCustomPlayerColor = false;
  local_68.m_iPlayerCount = 0;
  local_68.m_iScore = 0;
  local_68.m_iPresent = 0;
  local_68.m_iTies = 0;
  FScanner::MustGetString(Scan);
  FString::operator=(&local_68.m_Name,Scan->String);
  FScanner::MustGetStringName(Scan,"{");
  iVar1 = -1;
  while (iVar4 = iVar1, bVar2 = FScanner::CheckString(Scan,"}"), !bVar2) {
    FScanner::MustGetString(Scan);
    iVar3 = FScanner::MatchString(Scan,TeamInfoOptions,8);
    iVar1 = iVar4;
    switch(iVar3) {
    case 0:
      FScanner::MustGetString(Scan);
      bVar2 = FScanner::Compare(Scan,"Any");
      iVar1 = 1;
      if (((!bVar2) &&
          (iVar3 = strcasecmp(Scan->String,GameNames[(int)gameinfo.gametype]), iVar3 != 0)) &&
         (iVar1 = iVar4, iVar4 == -1)) {
        iVar1 = 0;
      }
      break;
    case 1:
      FScanner::MustGetString(Scan);
      local_68.m_iPlayerColor = V_GetColor((DWORD *)0x0,Scan->String);
      break;
    case 2:
      FScanner::MustGetString(Scan);
      FString::AppendFormat(&local_68.m_TextColor,"[%s]",Scan->String);
      break;
    case 3:
      FScanner::MustGetString(Scan);
      FString::operator=(&local_68.m_Logo,Scan->String);
      break;
    case 4:
      local_68.m_bAllowCustomPlayerColor = true;
      break;
    case 5:
    case 6:
    case 7:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
      FScanner::MustGetString(Scan);
      break;
    case 8:
      FScanner::MustGetNumber(Scan);
      break;
    default:
      FScanner::ScriptError(Scan,"ParseTeamDefinition: Unknown team option \'%s\'.\n",Scan->String);
    }
  }
  if (iVar4 != 0) {
    TArray<FTeam,_FTeam>::Push(&Teams,&local_68);
  }
  FString::~FString(&local_68.m_Logo);
  FString::~FString(&local_68.m_TextColor);
  FString::~FString(&local_68.m_Name);
  return;
}

Assistant:

void FTeam::ParseTeamDefinition (FScanner &Scan)
{
	FTeam Team;
	int valid = -1;
	Scan.MustGetString ();
	Team.m_Name = Scan.String;
	Scan.MustGetStringName ("{");

	while (!Scan.CheckString ("}"))
	{
		Scan.MustGetString ();

		switch (Scan.MatchString (TeamInfoOptions))
		{
		case TEAMINFO_Game:
			Scan.MustGetString ();
			if (Scan.Compare("Any")) valid = 1;
			else if (CheckGame(Scan.String, false)) valid = 1;
			else if (valid == -1) valid = 0;
			break;

		case TEAMINFO_PlayerColor:
			Scan.MustGetString ();
			Team.m_iPlayerColor = V_GetColor (NULL, Scan.String);
			break;

		case TEAMINFO_TextColor:
			Scan.MustGetString ();
			Team.m_TextColor.AppendFormat ("[%s]", Scan.String);
			break;

		case TEAMINFO_Logo:
			Scan.MustGetString ();
			Team.m_Logo = Scan.String;
			break;

		case TEAMINFO_AllowCustomPlayerColor:
			Team.m_bAllowCustomPlayerColor = true;
			break;

		case TEAMINFO_PlayerStartThingNumber:
			Scan.MustGetNumber ();
			break;

		case TEAMINFO_RailColor:
		case TEAMINFO_FlagItem:
		case TEAMINFO_SkullItem:
		case TEAMINFO_SmallFlagHUDIcon:
		case TEAMINFO_SmallSkullHUDIcon:
		case TEAMINFO_LargeFlagHUDIcon:
		case TEAMINFO_LargeSkullHUDIcon:
		case TEAMINFO_WinnerPic:
		case TEAMINFO_LoserPic:
		case TEAMINFO_WinnerTheme:
		case TEAMINFO_LoserTheme:
			Scan.MustGetString ();
			break;

		default:
			Scan.ScriptError ("ParseTeamDefinition: Unknown team option '%s'.\n", Scan.String);
			break;
		}
	}

	if (valid) Teams.Push (Team);
}